

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learning.h
# Opt level: O3

double __thiscall
klogic::learning::
teacher<klogic::mlmvn,_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_klogic::learning::learn_error<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
::mse<SingleSquareError>
          (teacher<klogic::mlmvn,_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_klogic::learning::learn_error<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
           *this,SingleSquareError *sq_err)

{
  pointer sample;
  double dVar1;
  desired_type actual;
  double local_b8;
  cvector local_a8;
  mlmvn_forward_base local_90;
  
  sample = (this->_samples).
           super__Vector_base<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (sample == (this->_samples).
                super__Vector_base<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    local_b8 = 0.0;
  }
  else {
    local_b8 = 0.0;
    do {
      mlmvn_forward_base::mlmvn_forward_base(&local_90,this->learner);
      mlmvn_forward::output(&local_a8,(mlmvn_forward *)&local_90,&sample->input);
      if (local_90.layer2.
          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.layer2.
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_90.layer2.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.layer2.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_90.layer1.
          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.layer1.
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_90.layer1.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.layer1.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      dVar1 = PhaseSubtractor::phase_difference((PhaseSubtractor *)sq_err,sample,&local_a8);
      if (local_a8.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_b8 = local_b8 + dVar1 * dVar1;
      sample = sample + 1;
    } while (sample != (this->_samples).
                       super__Vector_base<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>
  ::vector((vector<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>
            *)&local_90,&this->_samples);
  std::
  vector<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>
  ::~vector((vector<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>
             *)&local_90);
  return local_b8 /
         (double)((int)((ulong)((long)local_90.net - (long)local_90.out._M_current) >> 4) *
                 -0x55555555);
}

Assistant:

double mse(SquareError const &sq_err = SquareError()) {
                double acc_error = 0.0;

                for (typename std::vector<Sample>::const_iterator i = _samples.begin();
                        i != _samples.end(); ++i) {

                    typename Sample::desired_type actual = learner.output(i->input);

                    acc_error += sq_err(*i, actual);
                }

                return acc_error / samples_count();
            }